

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall discordpp::ThreadMetadata::~ThreadMetadata(ThreadMetadata *this)

{
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&(this->create_timestamp).
                 super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .t_);
  std::unique_ptr<bool,_std::default_delete<bool>_>::~unique_ptr
            (&(this->invitable).super_field<bool>.t_);
  std::unique_ptr<bool,_std::default_delete<bool>_>::~unique_ptr(&(this->locked).t_);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&(this->archive_timestamp).t_);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&(this->auto_archive_duration).t_);
  std::unique_ptr<bool,_std::default_delete<bool>_>::~unique_ptr
            ((unique_ptr<bool,_std::default_delete<bool>_> *)this);
  return;
}

Assistant:

ThreadMetadata(
        field<bool> archived = uninitialized,
        field<int> auto_archive_duration = uninitialized,
        field<Timestamp> archive_timestamp = uninitialized,
        field<bool> locked = uninitialized,
        omittable_field<bool> invitable = omitted,
        nullable_omittable_field<Timestamp> create_timestamp = omitted
    ):
        archived(archived),
        auto_archive_duration(auto_archive_duration),
        archive_timestamp(archive_timestamp),
        locked(locked),
        invitable(invitable),
        create_timestamp(create_timestamp)
    {}